

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O1

CordzStatistics * __thiscall
absl::lts_20250127::cord_internal::CordzInfo::GetCordzStatistics
          (CordzStatistics *__return_storage_ptr__,CordzInfo *this)

{
  size_t *psVar1;
  RefcountAndFlags *pRVar2;
  uint uVar3;
  int iVar4;
  CordRepKind CVar5;
  CordRep *rep;
  int i;
  long lVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  RepRef rep_00;
  CordRepAnalyzer analyzer;
  CordRepAnalyzer local_50;
  RepRef local_38;
  
  lVar6 = 0;
  memset(__return_storage_ptr__,0,0x150);
  __return_storage_ptr__->method = this->method_;
  __return_storage_ptr__->parent_method = this->parent_method_;
  do {
    (__return_storage_ptr__->update_tracker).values_[lVar6].super_atomic<long>.
    super___atomic_base<long>._M_i =
         (this->update_tracker_).values_[lVar6].super_atomic<long>.super___atomic_base<long>._M_i;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x19);
  Mutex::Lock(&this->mutex_);
  rep = this->rep_;
  if (rep == (CordRep *)0x0) {
    rep = (CordRep *)0x0;
  }
  else {
    LOCK();
    (rep->refcount).count_.super___atomic_base<int>._M_i =
         (rep->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
  }
  Mutex::Unlock(&this->mutex_);
  if (rep != (CordRep *)0x0) {
    __return_storage_ptr__->size = rep->length;
    local_50.memory_usage_.total = 0;
    local_50.memory_usage_.fair_share = 0.0;
    uVar3 = (rep->refcount).count_.super___atomic_base<int>._M_i >> 1;
    iVar4 = 1;
    if (1 < uVar3) {
      iVar4 = uVar3 - 1;
    }
    sVar7 = (size_t)iVar4;
    local_38.refcount = sVar7;
    local_38.rep = rep;
    local_50.statistics_ = __return_storage_ptr__;
    CVar5 = anon_unknown_16::CordRepAnalyzer::RepRef::tag(&local_38);
    if (CVar5 == CRC) {
      (local_50.statistics_)->node_count = (local_50.statistics_)->node_count + 1;
      psVar1 = &((local_50.statistics_)->node_counts).crc;
      *psVar1 = *psVar1 + 1;
      local_50.memory_usage_.total = local_50.memory_usage_.total + 0x20;
      auVar8._8_4_ = iVar4 >> 0x1f;
      auVar8._0_8_ = sVar7;
      auVar8._12_4_ = 0x45300000;
      local_50.memory_usage_.fair_share =
           32.0 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) +
           local_50.memory_usage_.fair_share;
      if (rep->tag != '\x02') {
        __assert_fail("IsCrc()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                      ,0x5f,"const CordRepCrc *absl::cord_internal::CordRep::crc() const");
      }
      local_38.rep = (CordRep *)rep[1].length;
      if (local_38.rep == (CordRep *)0x0) {
        local_38.rep = (CordRep *)0x0;
        local_38.refcount = 0;
      }
      else {
        local_38.refcount =
             (long)(((local_38.rep)->refcount).count_.super___atomic_base<int>._M_i >> 1) * sVar7;
      }
    }
    rep_00 = anon_unknown_16::CordRepAnalyzer::CountLinearReps
                       (&local_50,local_38,&local_50.memory_usage_);
    local_38 = rep_00;
    CVar5 = anon_unknown_16::CordRepAnalyzer::RepRef::tag(&local_38);
    if (CVar5 == BTREE) {
      anon_unknown_16::CordRepAnalyzer::AnalyzeBtree(&local_50,rep_00);
    }
    else {
      CVar5 = anon_unknown_16::CordRepAnalyzer::RepRef::tag(&local_38);
      if (CVar5 != UNUSED_0) {
        GetCordzStatistics();
        goto LAB_0024ea10;
      }
    }
    (local_50.statistics_)->estimated_memory_usage =
         (local_50.statistics_)->estimated_memory_usage + local_50.memory_usage_.total;
    (local_50.statistics_)->estimated_fair_share_memory_usage =
         (local_50.statistics_)->estimated_fair_share_memory_usage +
         ((long)(local_50.memory_usage_.fair_share - 9.223372036854776e+18) &
          (long)local_50.memory_usage_.fair_share >> 0x3f | (long)local_50.memory_usage_.fair_share)
    ;
    LOCK();
    pRVar2 = &rep->refcount;
    uVar3 = (pRVar2->count_).super___atomic_base<int>._M_i;
    (pRVar2->count_).super___atomic_base<int>._M_i =
         (pRVar2->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar3 & 1) == 0 && (int)uVar3 < 1) {
LAB_0024ea10:
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar3 == 2) {
      CordRep::Destroy(rep);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CordzStatistics CordzInfo::GetCordzStatistics() const {
  CordzStatistics stats;
  stats.method = method_;
  stats.parent_method = parent_method_;
  stats.update_tracker = update_tracker_;
  if (CordRep* rep = RefCordRep()) {
    stats.size = rep->length;
    CordRepAnalyzer analyzer(stats);
    analyzer.AnalyzeCordRep(rep);
    CordRep::Unref(rep);
  }
  return stats;
}